

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter_impl.h
# Opt level: O3

void lwlog::details::formatter::format_attribute<unsigned_long>
               (string *pattern,flag_pair *flags,unsigned_long value)

{
  char *pcVar1;
  bool bVar2;
  char cVar3;
  char *pcVar4;
  ulong uVar5;
  unsigned_long uVar6;
  char cVar7;
  string str_value;
  long *local_48;
  uint local_40;
  long local_38 [2];
  
  cVar7 = '\x01';
  if (9 < value) {
    uVar6 = value;
    cVar3 = '\x04';
    do {
      cVar7 = cVar3;
      if (uVar6 < 100) {
        cVar7 = cVar7 + -2;
        goto LAB_0010d93e;
      }
      if (uVar6 < 1000) {
        cVar7 = cVar7 + -1;
        goto LAB_0010d93e;
      }
      if (uVar6 < 10000) goto LAB_0010d93e;
      bVar2 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      cVar3 = cVar7 + '\x04';
    } while (bVar2);
    cVar7 = cVar7 + '\x01';
  }
LAB_0010d93e:
  local_48 = local_38;
  std::__cxx11::string::_M_construct((ulong)&local_48,cVar7);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_48,local_40,value);
  while( true ) {
    pcVar1 = (flags->verbose)._M_str;
    pcVar4 = strstr((pattern->_M_dataplus)._M_p,pcVar1);
    if (pcVar4 == (char *)0x0) break;
    uVar5 = std::__cxx11::string::find((char *)pattern,(ulong)pcVar1,0);
    std::__cxx11::string::replace
              ((ulong)pattern,uVar5,(char *)(flags->verbose)._M_len,(ulong)local_48);
  }
  while( true ) {
    pcVar1 = (flags->shortened)._M_str;
    pcVar4 = strstr((pattern->_M_dataplus)._M_p,pcVar1);
    if (pcVar4 == (char *)0x0) break;
    uVar5 = std::__cxx11::string::find((char *)pattern,(ulong)pcVar1,0);
    std::__cxx11::string::replace
              ((ulong)pattern,uVar5,(char *)(flags->shortened)._M_len,(ulong)local_48);
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return;
}

Assistant:

void formatter::format_attribute(std::string& pattern, const flag_pair& flags, T value)
	{
		const std::string str_value = [&value]() {
			if constexpr (std::is_arithmetic_v<T>)					return std::to_string(value);
			else if constexpr (std::is_same_v<T, std::string>)		return value;
			else if constexpr (std::is_same_v<T, std::string_view>)	return value.data();
			else if constexpr (std::is_same_v<T, const char*>)		return value;
			else													return "";
		}();

		const auto& [verbose, shortened] = flags;
		while (std::strstr(pattern.data(), verbose.data()))
		{
			pattern.replace(pattern.find(verbose), verbose.length(), str_value);
		}

		while (std::strstr(pattern.data(), shortened.data()))
		{
			pattern.replace(pattern.find(shortened), shortened.length(), str_value);
		}
	}